

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroupPrivate::connectUncontrolledAnimations(QParallelAnimationGroupPrivate *this)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QAbstractAnimation **ppQVar3;
  int *piVar4;
  QList<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  AnimationListConstIt cend;
  AnimationListConstIt it;
  QAbstractAnimation *anim;
  const_iterator this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QAbstractAnimation_*>::constBegin(in_RDI);
  o = QList<QAbstractAnimation_*>::constEnd(in_RDI);
  do {
    this_00 = o;
    bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    ppQVar3 = QList<QAbstractAnimation_*>::const_iterator::operator*(&local_10);
    anim = *ppQVar3;
    iVar2 = (*(anim->super_QObject)._vptr_QObject[0xc])();
    if (iVar2 == -1) {
LAB_0067d5f2:
      piVar4 = QHash<QAbstractAnimation_*,_int>::operator[]
                         ((QHash<QAbstractAnimation_*,_int> *)this_00.i,(QAbstractAnimation **)anim)
      ;
      *piVar4 = -1;
      QAnimationGroupPrivate::connectUncontrolledAnimation((QAnimationGroupPrivate *)this_00.i,anim)
      ;
    }
    else {
      iVar2 = QAbstractAnimation::loopCount((QAbstractAnimation *)in_RDI);
      if (iVar2 < 0) goto LAB_0067d5f2;
    }
    QList<QAbstractAnimation_*>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

void QParallelAnimationGroupPrivate::connectUncontrolledAnimations()
{
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it) {
        QAbstractAnimation *animation = *it;
        if (animation->duration() == -1 || animation->loopCount() < 0) {
            uncontrolledFinishTime[animation] = -1;
            connectUncontrolledAnimation(animation);
        }
    }
}